

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_scroll.cpp
# Opt level: O1

void __thiscall DScroller::Destroy(DScroller *this)

{
  long lVar1;
  
  lVar1 = 0xf;
  do {
    if (this->m_Interpolations[lVar1 + -0xf].field_0.p != (DInterpolation *)0x0) {
      if ((*(byte *)((long)this->m_Interpolations[lVar1 + -0xf].field_0.p + 0x20) & 0x20) == 0) {
        DInterpolation::DelRef(this->m_Interpolations[lVar1 + -0xf].field_0.p,false);
      }
      this->m_Interpolations[lVar1 + -0xf].field_0 =
           (anon_union_8_2_947301c2_for_TObjPtr<DInterpolation>_1)0x0;
    }
    lVar1 = lVar1 + 1;
  } while (lVar1 != 0x12);
  DThinker::Destroy(&this->super_DThinker);
  return;
}

Assistant:

void DScroller::Destroy ()
{
	for(int i=0;i<3;i++)
	{
		if (m_Interpolations[i] != NULL)
		{
			m_Interpolations[i]->DelRef();
			m_Interpolations[i] = NULL;
		}
	}
	Super::Destroy();
}